

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cryptor.h
# Opt level: O2

void __thiscall Cryptor::Cryptor(Cryptor *this,string *message)

{
  this->_vptr_Cryptor = (_func_int **)&PTR__Cryptor_0010eb28;
  std::__cxx11::string::string((string *)&this->in_message_,(string *)message);
  (this->out_message_)._M_dataplus._M_p = (pointer)&(this->out_message_).field_2;
  (this->out_message_)._M_string_length = 0;
  (this->out_message_).field_2._M_local_buf[0] = '\0';
  this->show_ = false;
  return;
}

Assistant:

explicit Cryptor(std::string message) : in_message_(std::move(message)) {}